

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String testing::internal::GetCurrentOsStackTraceExceptTop(UnitTest *param_1,int skip_count)

{
  size_t extraout_RDX;
  String SVar1;
  
  GetUnitTestImpl();
  String::String((String *)param_1,"");
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)param_1;
  return SVar1;
}

Assistant:

String GetCurrentOsStackTraceExceptTop(UnitTest* /*unit_test*/,
                                       int skip_count) {
  // We pass skip_count + 1 to skip this wrapper function in addition
  // to what the user really wants to skip.
  return GetUnitTestImpl()->CurrentOsStackTraceExceptTop(skip_count + 1);
}